

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O0

void __thiscall anon_unknown.dwarf_6be18a::HandleTransformCommand::Command::~Command(Command *this)

{
  Command *this_local;
  
  std::__cxx11::string::~string((string *)&this->OutputName);
  std::
  unique_ptr<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
  ::~unique_ptr(&this->Selector);
  std::
  unique_ptr<(anonymous_namespace)::TransformAction,_std::default_delete<(anonymous_namespace)::TransformAction>_>
  ::~unique_ptr(&this->Action);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->Arguments);
  std::__cxx11::string::~string((string *)&this->ListName);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

Command(const std::string& listName)
      : ListName(listName)
      , OutputName(listName)
    {
    }